

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_kneip::groebnerRow53_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  lVar33 = (long)targetRow;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x228c];
  auVar32._8_8_ = 0x8000000000000000;
  auVar32._0_8_ = 0x8000000000000000;
  auVar34 = vxorpd_avx512vl(auVar35,auVar32);
  auVar36._0_8_ =
       auVar34._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x22c1];
  auVar36._8_8_ = auVar34._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x228c] = 0.0;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2303];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x22ce];
  auVar34 = vfmadd213sd_fma(auVar37,auVar36,auVar34);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x22ce] = auVar34._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2345];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2310];
  auVar34 = vfmadd213sd_fma(auVar38,auVar36,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2310] = auVar34._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2387];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2352];
  auVar34 = vfmadd213sd_fma(auVar39,auVar36,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2352] = auVar34._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x23c9];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2394];
  auVar34 = vfmadd213sd_fma(auVar40,auVar36,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2394] = auVar34._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x240b];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x23d6];
  auVar34 = vfmadd213sd_fma(auVar41,auVar36,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x23d6] = auVar34._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x244d];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2418];
  auVar34 = vfmadd213sd_fma(auVar42,auVar36,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2418] = auVar34._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x248f];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x245a];
  auVar34 = vfmadd213sd_fma(auVar43,auVar36,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x245a] = auVar34._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c09];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2bd4];
  auVar34 = vfmadd213sd_fma(auVar44,auVar36,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2bd4] = auVar34._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c4b];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2c16];
  auVar34 = vfmadd213sd_fma(auVar45,auVar36,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2c16] = auVar34._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ccf];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar33 + 0x2c9a];
  auVar34 = vfmadd213sd_fma(auVar46,auVar36,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2c9a] = auVar34._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d11];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2cdc];
  auVar34 = vfmadd213sd_fma(auVar47,auVar36,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2cdc] = auVar34._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d95];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2d60];
  auVar34 = vfmadd213sd_fma(auVar48,auVar36,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2d60] = auVar34._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2dd7];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2da2];
  auVar34 = vfmadd213sd_fma(auVar49,auVar36,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2da2] = auVar34._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e19];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2de4];
  auVar34 = vfmadd213sd_fma(auVar50,auVar36,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2de4] = auVar34._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e5b];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2e26];
  auVar34 = vfmadd213sd_fma(auVar51,auVar36,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2e26] = auVar34._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e9d];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2e68];
  auVar34 = vfmadd213sd_fma(auVar52,auVar36,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2e68] = auVar34._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[11999];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2eaa];
  auVar34 = vfmadd213sd_fma(auVar53,auVar36,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2eaa] = auVar34._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f21];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2eec];
  auVar34 = vfmadd213sd_fma(auVar54,auVar36,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2eec] = auVar34._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f63];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2f2e];
  auVar34 = vfmadd213sd_fma(auVar55,auVar36,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2f2e] = auVar34._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fa5];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2f70];
  auVar34 = vfmadd213sd_fma(auVar56,auVar36,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2f70] = auVar34._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fe7];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2fb2];
  auVar34 = vfmadd213sd_fma(auVar57,auVar36,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2fb2] = auVar34._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3029];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x2ff4];
  auVar34 = vfmadd213sd_fma(auVar58,auVar36,auVar21);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x2ff4] = auVar34._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x306b];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x3036];
  auVar34 = vfmadd213sd_fma(auVar59,auVar36,auVar22);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x3036] = auVar34._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30ad];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x3078];
  auVar34 = vfmadd213sd_fma(auVar60,auVar36,auVar23);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x3078] = auVar34._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30ef];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x30ba];
  auVar34 = vfmadd213sd_fma(auVar61,auVar36,auVar24);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x30ba] = auVar34._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3131];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x30fc];
  auVar34 = vfmadd213sd_fma(auVar62,auVar36,auVar25);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x30fc] = auVar34._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3173];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x313e];
  auVar34 = vfmadd213sd_fma(auVar63,auVar36,auVar26);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x313e] = auVar34._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31b5];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x3180];
  auVar34 = vfmadd213sd_fma(auVar64,auVar36,auVar27);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x3180] = auVar34._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31f7];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x31c2];
  auVar34 = vfmadd213sd_fma(auVar65,auVar36,auVar28);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x31c2] = auVar34._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3239];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x3204];
  auVar34 = vfmadd213sd_fma(auVar66,auVar36,auVar29);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x3204] = auVar34._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x327b];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x3246];
  auVar34 = vfmadd213sd_fma(auVar67,auVar36,auVar30);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x3246] = auVar34._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x32bd];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar33 + 0x3288];
  auVar34 = vfmadd213sd_fma(auVar68,auVar36,auVar31);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar33 + 0x3288] = auVar34._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow53_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,134) / groebnerMatrix(53,134);
  groebnerMatrix(targetRow,134) = 0.0;
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(53,135);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(53,136);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(53,137);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(53,138);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(53,139);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(53,140);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(53,141);
  groebnerMatrix(targetRow,170) -= factor * groebnerMatrix(53,170);
  groebnerMatrix(targetRow,171) -= factor * groebnerMatrix(53,171);
  groebnerMatrix(targetRow,173) -= factor * groebnerMatrix(53,173);
  groebnerMatrix(targetRow,174) -= factor * groebnerMatrix(53,174);
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(53,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(53,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(53,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(53,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(53,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(53,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(53,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(53,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(53,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(53,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(53,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(53,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(53,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(53,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(53,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(53,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(53,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(53,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(53,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(53,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(53,196);
}